

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_html_comment(MD_CTX *ctx,MD_LINE *lines,MD_SIZE n_lines,MD_OFFSET beg,MD_OFFSET max_end,
                      MD_OFFSET *p_end)

{
  int in_ECX;
  long in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  MD_CHAR *in_R9;
  MD_OFFSET *unaff_retaddr;
  MD_OFFSET off;
  MD_LINE *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_ECX + 4U < *(uint *)(in_RSI + 4)) {
    if (((*(char *)(*in_RDI + (ulong)(in_ECX + 1)) == '!') &&
        (*(char *)(*in_RDI + (ulong)(in_ECX + 2)) == '-')) &&
       (*(char *)(*in_RDI + (ulong)(in_ECX + 3)) == '-')) {
      iVar1 = md_scan_for_html_closer
                        ((MD_CTX *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_R9,in_ECX + 2,
                         in_stack_ffffffffffffffc0,(MD_SIZE)((ulong)(in_RDI + 0x3f) >> 0x20),
                         (MD_OFFSET)(in_RDI + 0x3f),(MD_OFFSET)in_RDI,
                         (MD_OFFSET *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         unaff_retaddr);
    }
    else {
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
md_is_html_comment(MD_CTX* ctx, const MD_LINE* lines, MD_SIZE n_lines, OFF beg, OFF max_end, OFF* p_end)
{
    OFF off = beg;

    MD_ASSERT(CH(beg) == _T('<'));

    if(off + 4 >= lines[0].end)
        return FALSE;
    if(CH(off+1) != _T('!')  ||  CH(off+2) != _T('-')  ||  CH(off+3) != _T('-'))
        return FALSE;

    /* Skip only "<!" so that we accept also "<!-->" or "<!--->" */
    off += 2;

    /* Scan for ordinary comment closer "-->". */
    return md_scan_for_html_closer(ctx, _T("-->"), 3,
                lines, n_lines, off, max_end, p_end, &ctx->html_comment_horizon);
}